

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::reserve
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this,
          size_t n)

{
  memory_resource *pmVar1;
  ShapeHandle *pSVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  int i;
  ulong uVar6;
  ShapeHandle *pSVar5;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar4 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 8,8);
    pSVar5 = (ShapeHandle *)CONCAT44(extraout_var,iVar4);
    pSVar2 = this->ptr;
    uVar3 = this->nStored;
    for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
      pSVar5[uVar6].
      super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
      .bits = 0;
      pSVar5[uVar6].
      super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
      .bits = pSVar2[uVar6].
              super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
              .bits;
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,pSVar2,this->nAlloc << 3,8);
    this->nAlloc = n;
    this->ptr = pSVar5;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }